

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void PPC_printInst(MCInst *MI,SStream *O,void *Info)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  char cVar5;
  cs_detail *pcVar6;
  bool bVar7;
  bool bVar8;
  _Bool _Var9;
  uint uVar10;
  uint uVar11;
  arm64_cc aVar12;
  MCOperand *pMVar13;
  ulong uVar14;
  int64_t iVar15;
  int64_t iVar16;
  MCRegisterClass *pMVar17;
  size_t sVar18;
  long lVar19;
  cs_struct *pcVar20;
  uint *Modifier;
  SStream *O_00;
  SStream *O_01;
  uint OpNo;
  int v;
  char *pcVar21;
  char *pcVar22;
  ppc_alias alias;
  ulong local_240;
  SStream local_238;
  
  uVar10 = MCInst_getOpcode(MI);
  if (uVar10 == 0x311) {
    pMVar13 = MCInst_getOperand(MI,2);
    local_240 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,3);
    uVar14 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,4);
    iVar15 = MCOperand_getImm(pMVar13);
    uVar10 = (uint)local_240 & 0xff;
    if (((uVar14 & 0xff) == 0 && uVar10 < 0x20) && (((uint)iVar15 & 0xff) == 0x1f - uVar10)) {
      SStream_concat0(O,"slwi\t");
      MCInst_setOpcodePub(MI,0x301);
      bVar8 = true;
    }
    else {
      bVar8 = false;
    }
    if ((uVar10 < 0x20) && ((char)iVar15 == '\x1f' && ((uint)uVar14 & 0xff) == 0x20 - uVar10)) {
      SStream_concat0(O,"srwi\t");
      MCInst_setOpcodePub(MI,0x302);
      bVar8 = true;
      local_240 = (ulong)(0x20 - uVar10);
    }
    if (bVar8) {
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      pcVar21 = ", %u";
      if (9 < (byte)local_240) {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,local_240 & 0xff);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar6 = MI->flat_insn->detail;
      bVar4 = (pcVar6->field_6).x86.addr_size;
      lVar19 = (ulong)bVar4 * 0x10;
      puVar3 = pcVar6->groups + lVar19 + 0x1a;
      puVar3[0] = '\x02';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(uint *)(pcVar6->groups + lVar19 + 0x1e) = (uint)(byte)local_240;
      (pcVar6->field_6).x86.addr_size = bVar4 + 1;
      return;
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if ((uVar10 == 0x2e8) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x2e9)) {
    pMVar13 = MCInst_getOperand(MI,1);
    uVar10 = MCOperand_getReg(pMVar13);
    pMVar13 = MCInst_getOperand(MI,2);
    uVar11 = MCOperand_getReg(pMVar13);
    if (uVar10 == uVar11) {
      SStream_concat0(O,"mr\t");
      MCInst_setOpcodePub(MI,0x34c);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      return;
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if (uVar10 == 0x308) {
    pMVar13 = MCInst_getOperand(MI,2);
    iVar15 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,3);
    iVar16 = MCOperand_getImm(pMVar13);
    uVar10 = (uint)iVar15 & 0xff;
    if (0x3f - uVar10 == ((uint)iVar16 & 0xff)) {
      SStream_concat0(O,"sldi\t");
      MCInst_setOpcodePub(MI,0x303);
      printOperand(MI,0,O);
      SStream_concat0(O,", ");
      printOperand(MI,1,O);
      if (uVar10 < 10) {
        pcVar21 = ", %u";
      }
      else {
        pcVar21 = ", 0x%x";
      }
      SStream_concat(O,pcVar21,(ulong)uVar10);
      return;
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if ((((uVar10 == 0x4ed) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4ee)) ||
      (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4f1)) ||
     (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x4f2)) {
    pMVar13 = MCInst_getOperand(MI,2);
    iVar15 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,2);
    MCOperand_setImm(pMVar13,(iVar15 << 0x32) >> 0x32);
  }
  uVar10 = MCInst_getOpcode(MI);
  if (0xffffffd7 < uVar10 - 0xba) {
    pMVar13 = MCInst_getOperand(MI,0);
    _Var9 = MCOperand_isImm(pMVar13);
    if (_Var9) {
      pMVar13 = MCInst_getOperand(MI,0);
      iVar15 = MCOperand_getImm(pMVar13);
      pMVar13 = MCInst_getOperand(MI,0);
      MCOperand_setImm(pMVar13,(iVar15 << 0x32) >> 0x32);
    }
  }
  uVar10 = MCInst_getOpcode(MI);
  if (((uVar10 == 0x71) || (uVar10 = MCInst_getOpcode(MI), uVar10 == 0x72)) ||
     ((uVar10 = MCInst_getOpcode(MI), uVar10 == 0xba ||
      (uVar10 = MCInst_getOpcode(MI), uVar10 == 0xc0)))) {
    pMVar13 = MCInst_getOperand(MI,0);
    iVar15 = MCOperand_getImm(pMVar13);
    pMVar13 = MCInst_getOperand(MI,0);
    MCOperand_setImm(pMVar13,(iVar15 << 0x28) >> 0x28);
  }
  SStream_Init(&local_238);
  uVar10 = MCInst_getOpcode(MI);
  pcVar21 = (char *)0x0;
  bVar8 = false;
  if (uVar10 - 0x4ed < 8) {
    pcVar21 = (&PTR_anon_var_dwarf_bc90b_0028f000)[uVar10 - 0x4ed];
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      bVar8 = false;
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        bVar8 = false;
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (-1 < iVar15) {
          bVar8 = false;
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 2) {
            SStream_concat(&local_238,pcVar21,"dnzf");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (1 < iVar15) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 4) {
            SStream_concat(&local_238,pcVar21,"dzf");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (3 < iVar15) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 8) {
            pMVar13 = MCInst_getOperand(MI,1);
            _Var9 = MCOperand_isReg(pMVar13);
            if (_Var9) {
              pMVar17 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              _Var9 = MCRegisterClass_contains(pMVar17,uVar10);
              if (_Var9) {
                pMVar13 = MCInst_getOperand(MI,1);
                uVar10 = MCOperand_getReg(pMVar13);
                uVar10 = (int)(uVar10 - 0xf7) >> 3;
                if (uVar10 < 4) {
                  SStream_concat(&local_238,pcVar21,
                                 &DAT_001ef3e8 + *(int *)(&DAT_001ef3e8 + (ulong)uVar10 * 4));
                }
                bVar8 = false;
                pMVar13 = MCInst_getOperand(MI,0);
                iVar15 = MCOperand_getImm(pMVar13);
                if (iVar15 == 6) {
                  SStream_concat0(&local_238,"-");
                }
                pMVar13 = MCInst_getOperand(MI,0);
                iVar15 = MCOperand_getImm(pMVar13);
                if (iVar15 == 7) {
                  SStream_concat0(&local_238,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (7 < iVar15) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 10) {
            SStream_concat(&local_238,pcVar21,"dnzt");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (9 < iVar15) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 0xc) {
            SStream_concat(&local_238,pcVar21,"dzt");
            bVar8 = true;
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (0xb < iVar15) {
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 < 0x10) {
            pMVar13 = MCInst_getOperand(MI,1);
            _Var9 = MCOperand_isReg(pMVar13);
            if (_Var9) {
              pMVar17 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
              pMVar13 = MCInst_getOperand(MI,1);
              uVar10 = MCOperand_getReg(pMVar13);
              _Var9 = MCRegisterClass_contains(pMVar17,uVar10);
              if (_Var9) {
                pMVar13 = MCInst_getOperand(MI,1);
                uVar10 = MCOperand_getReg(pMVar13);
                uVar10 = (int)(uVar10 - 0xf7) >> 3;
                if (uVar10 < 4) {
                  SStream_concat(&local_238,pcVar21,
                                 &DAT_001ef3f8 + *(int *)(&DAT_001ef3f8 + (ulong)uVar10 * 4));
                }
                bVar8 = false;
                pMVar13 = MCInst_getOperand(MI,0);
                iVar15 = MCOperand_getImm(pMVar13);
                if (iVar15 == 0xe) {
                  SStream_concat0(&local_238,"-");
                }
                pMVar13 = MCInst_getOperand(MI,0);
                iVar15 = MCOperand_getImm(pMVar13);
                if (iVar15 == 0xf) {
                  SStream_concat0(&local_238,"+");
                }
              }
            }
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if (((uint)iVar15 & 0x12) == 0x10) {
          SStream_concat(&local_238,pcVar21,"dnz");
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 == 0x18) {
            SStream_concat0(&local_238,"-");
          }
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 == 0x19) {
            SStream_concat0(&local_238,"+");
          }
        }
      }
    }
    uVar10 = MCInst_getNumOperands(MI);
    if (uVar10 == 3) {
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (_Var9) {
        pMVar13 = MCInst_getOperand(MI,0);
        iVar15 = MCOperand_getImm(pMVar13);
        if ((~(uint)iVar15 & 0x12) == 0) {
          SStream_concat(&local_238,pcVar21,"dz");
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 == 0x1a) {
            SStream_concat0(&local_238,"-");
          }
          pMVar13 = MCInst_getOperand(MI,0);
          iVar15 = MCOperand_getImm(pMVar13);
          if (iVar15 == 0x1b) {
            SStream_concat0(&local_238,"+");
          }
        }
      }
    }
    pMVar13 = MCInst_getOperand(MI,1);
    _Var9 = MCOperand_isReg(pMVar13);
    bVar7 = true;
    if (_Var9) {
      pMVar17 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,3);
      pMVar13 = MCInst_getOperand(MI,1);
      uVar10 = MCOperand_getReg(pMVar13);
      _Var9 = MCRegisterClass_contains(pMVar17,uVar10);
      if (!_Var9) goto LAB_00192808;
      pMVar13 = MCInst_getOperand(MI,0);
      _Var9 = MCOperand_isImm(pMVar13);
      if (!_Var9) goto LAB_00192808;
      pMVar13 = MCInst_getOperand(MI,0);
      iVar15 = MCOperand_getImm(pMVar13);
      if (0xf < iVar15) goto LAB_00192808;
      pMVar13 = MCInst_getOperand(MI,1);
      uVar10 = MCOperand_getReg(pMVar13);
      uVar10 = uVar10 + 1 & 7;
      if (!bVar8) {
        if (uVar10 != 0) {
          bVar7 = false;
          SStream_concat(&local_238," cr%d",(ulong)uVar10);
          op_addReg(MI,uVar10 + 3);
        }
        goto LAB_00192808;
      }
      SStream_concat0(&local_238," ");
      if (uVar10 != 0) {
        SStream_concat(&local_238,"4*cr%d+",(ulong)uVar10);
      }
      pMVar13 = MCInst_getOperand(MI,1);
      uVar10 = MCOperand_getReg(pMVar13);
      switch((int)(uVar10 - 0xf7) >> 3) {
      case 0:
        SStream_concat0(&local_238,"eq");
        pcVar20 = MI->csh;
        aVar12 = 0x4c;
        break;
      case 1:
        SStream_concat0(&local_238,"gt");
        pcVar20 = MI->csh;
        aVar12 = 0x2c;
        break;
      case 2:
        SStream_concat0(&local_238,"lt");
        pcVar20 = MI->csh;
        aVar12 = ARM64_CC_LT;
        break;
      case 3:
        SStream_concat0(&local_238,"so");
        pcVar20 = MI->csh;
        aVar12 = 0x8c;
        break;
      default:
        goto switchD_00192664_default;
      }
      if (pcVar20->detail != CS_OPT_OFF) {
        (MI->flat_insn->detail->field_6).arm64.cc = aVar12;
      }
switchD_00192664_default:
      pMVar13 = MCInst_getOperand(MI,1);
      uVar10 = MCOperand_getReg(pMVar13);
      uVar10 = uVar10 + 1 & 7;
      if ((uVar10 != 0) && (MI->csh->detail != CS_OPT_OFF)) {
        pcVar6 = MI->flat_insn->detail;
        puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1a;
        puVar3[0] = '@';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar6 = MI->flat_insn->detail;
        puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x1e;
        puVar3[0] = '\x04';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar6 = MI->flat_insn->detail;
        *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x22) =
             uVar10 + 3;
        pcVar6 = MI->flat_insn->detail;
        *(undefined4 *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.addr_size * 0x10 + 0x26) =
             *(undefined4 *)(pcVar6->field_6).x86.prefix;
        puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
        *puVar3 = *puVar3 + '\x01';
      }
      bVar7 = false;
    }
LAB_00192808:
    pMVar13 = MCInst_getOperand(MI,2);
    _Var9 = MCOperand_isImm(pMVar13);
    if (_Var9) {
      pMVar13 = MCInst_getOperand(MI,2);
      iVar15 = MCOperand_getImm(pMVar13);
      if (iVar15 != 0) {
        if (!bVar7) {
          SStream_concat0(&local_238,",");
        }
        SStream_concat0(&local_238,anon_var_dwarf_bccf2 + 4);
      }
    }
    pcVar21 = cs_strdup(local_238.buffer);
    for (pcVar22 = pcVar21; cVar5 = *pcVar22, cVar5 != '\0'; pcVar22 = pcVar22 + 1) {
      if ((cVar5 == ' ') || (cVar5 == '\t')) {
        *pcVar22 = '\0';
        pcVar22 = pcVar22 + 1;
        break;
      }
    }
    SStream_concat0(O,pcVar21);
    if (*pcVar22 != '\0') {
      SStream_concat0(O,anon_var_dwarf_79360 + 0x11);
      do {
        cVar5 = *pcVar22;
        if (cVar5 == '$') {
          pcVar1 = pcVar22 + 1;
          if (*pcVar1 == -1) {
            pcVar1 = pcVar22 + 2;
            pcVar2 = pcVar22 + 3;
            pcVar22 = pcVar22 + 3;
            printCustomAliasOperand(MI,(int)*pcVar1 - 1,(int)*pcVar2 - 1,O);
          }
          else {
            pcVar22 = pcVar22 + 1;
            printOperand(MI,(int)*pcVar1 - 1,O);
          }
        }
        else {
          if (cVar5 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar5);
        }
        pcVar22 = pcVar22 + 1;
      } while( true );
    }
  }
  if (pcVar21 == (char *)0x0) {
    pcVar21 = printAliasInstr(MI,O,Info);
  }
  if (pcVar21 != (char *)0x0) {
    if (*pcVar21 != '\0') {
      sVar18 = strlen(pcVar21);
      if (((ulong)(byte)pcVar21[sVar18 - 1] < 0x2f) &&
         ((0x680000000000U >> ((ulong)(byte)pcVar21[sVar18 - 1] & 0x3f) & 1) != 0)) {
        pcVar21[sVar18 - 1] = '\0';
      }
      _Var9 = PPC_alias_insn(pcVar21,(ppc_alias *)&local_238);
      if ((_Var9) && (MCInst_setOpcodePub(MI,local_238.buffer._0_4_), MI->csh->detail != CS_OPT_OFF)
         ) {
        *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = local_238.buffer._4_4_;
      }
    }
    (*cs_mem_free)(pcVar21);
    return;
  }
  uVar10 = MCInst_getOpcode(MI);
  uVar10 = *(uint *)(printInstruction_OpInfo + (ulong)uVar10 * 4);
  uVar11 = MCInst_getOpcode(MI);
  bVar4 = printInstruction_OpInfo2[uVar11];
  SStream_concat0(O,(char *)((ulong)(uVar10 & 0x3fff) + 0x31ba0f));
  uVar11 = (uint)O;
  switch(uVar10 >> 0xe & 0xf) {
  case 1:
    OpNo = 0;
    goto LAB_00192b5e;
  case 2:
    printU16ImmOperand(MI,0,O);
    break;
  case 3:
    printBranchOperand(MI,0,O);
    break;
  case 4:
    printAbsBranchOperand(MI,0,O);
    break;
  case 5:
    printPredicateOperand
              (MI,uVar11,(SStream *)0x250605,(char *)&switchD_00192a2b::switchdataD_001ed2e0);
    break;
  case 6:
    set_mem_access(MI,true);
    SStream_concat0(O,"(");
    printOperand(MI,1,O);
    SStream_concat0(O,")");
    if (MI->csh->detail == CS_OPT_ON) {
      MI->csh->doing_mem = false;
      puVar3 = &(MI->flat_insn->detail->field_6).x86.addr_size;
      *puVar3 = *puVar3 + '\x01';
    }
    break;
  case 7:
    uVar10 = 0;
    goto LAB_00192b23;
  case 8:
    printU5ImmOperand(MI,0,O);
    break;
  case 9:
    OpNo = 1;
LAB_00192b5e:
    printOperand(MI,OpNo,O);
    break;
  case 10:
    uVar10 = 0;
    goto LAB_00192a6a;
  case 0xb:
    printcrbitm(MI,0,O);
    goto LAB_00192b3d;
  case 0xc:
    printU4ImmOperand(MI,uVar11,O_00);
    pcVar21 = ", ";
    goto LAB_00192b9f;
  default:
    goto switchD_00192a2b_default;
  }
  Modifier = &switchD_00192b8a::switchdataD_001ed310;
  switch(uVar10 >> 0x12 & 0x1f) {
  case 1:
  case 0xc:
    goto switchD_00192a2b_default;
  case 2:
    pcVar21 = " ";
    goto LAB_00192d56;
  case 4:
    pcVar21 = ",a";
    goto LAB_00192c19;
  case 5:
    pcVar21 = "ctr";
    break;
  case 6:
    pcVar21 = "ctrl";
    break;
  case 7:
    SStream_concat0(O,"l");
  case 3:
    printPredicateOperand(MI,uVar11,(SStream *)0x2570cd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar11,(SStream *)0x1eca86,(char *)Modifier);
    SStream_concat0(O,", ");
    uVar10 = 2;
    goto LAB_00192d45;
  case 8:
    pcVar21 = "bla";
LAB_00192c19:
    SStream_concat0(O,pcVar21 + 1);
    printPredicateOperand(MI,uVar11,(SStream *)0x2570cd,(char *)Modifier);
    SStream_concat0(O," ");
    printPredicateOperand(MI,uVar11,(SStream *)0x1eca86,(char *)Modifier);
    SStream_concat0(O,", ");
    goto LAB_00192c6e;
  case 9:
    pcVar21 = "lr";
    break;
  case 10:
    pcVar21 = "lrl";
    break;
  case 0xb:
    goto switchD_00192b8a_caseD_b;
  case 0xd:
    SStream_concat0(O,", 268");
    v = 0x10c;
    goto LAB_00192c8f;
  case 0xe:
    SStream_concat0(O,", 256");
    v = 0x100;
    goto LAB_00192c8f;
  case 0xf:
    pcVar21 = ",";
LAB_00192b9f:
    SStream_concat0(O,pcVar21);
    uVar10 = 0;
    goto LAB_00192baf;
  case 0x10:
    SStream_concat0(O,", -1");
    v = -1;
LAB_00192c8f:
    op_addImm(MI,v);
    return;
  default:
    pcVar21 = ", ";
LAB_00192d56:
    SStream_concat0(O,pcVar21);
    switch(uVar10 >> 0x17 & 0xf) {
    case 0:
      uVar11 = 1;
      goto LAB_00192da3;
    case 1:
      uVar10 = 1;
      goto LAB_00192e47;
    case 2:
      printMemRegReg(MI,1,O);
      goto LAB_00192e70;
    case 3:
      uVar10 = 1;
      goto LAB_00192d45;
    case 4:
      uVar11 = 0;
LAB_00192da3:
      printOperand(MI,uVar11,O);
      goto LAB_00192e70;
    case 5:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
LAB_00192e70:
      switch(uVar10 >> 0x1b & 0xf) {
      case 1:
        goto switchD_00192a2b_default;
      case 2:
        SStream_concat0(O," ");
        printOperand(MI,3,O);
        SStream_concat0(O," ");
        uVar10 = 4;
        goto LAB_00192baf;
      case 3:
        uVar10 = 0;
        break;
      case 4:
        printU6ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        uVar10 = 4;
        goto LAB_00192fbf;
      case 5:
        printU5ImmOperand(MI,3,O);
        SStream_concat0(O,", ");
        printU5ImmOperand(MI,4,O);
        SStream_concat0(O,", ");
        uVar10 = 5;
        break;
      case 6:
        uVar10 = 1;
        break;
      case 7:
switchD_00192b8a_caseD_b:
        pcVar21 = ", 0";
LAB_00192ed7:
        SStream_concat0(O,pcVar21);
        return;
      case 8:
        uVar10 = 3;
        goto LAB_00192baf;
      default:
        SStream_concat0(O,", ");
        switch((uint)(CONCAT14(bVar4,uVar10) >> 0x1f) & 0xf) {
        case 1:
          uVar10 = 2;
LAB_00192dbb:
          printS16ImmOperand(MI,uVar10,O);
          break;
        case 2:
          uVar10 = 2;
LAB_00192e47:
          printU16ImmOperand(MI,uVar10,O);
          break;
        case 3:
          printU6ImmOperand(MI,2,O);
          goto LAB_001930bc;
        case 4:
          printU5ImmOperand(MI,2,O);
          goto LAB_001930bc;
        case 5:
          uVar10 = 0;
          goto LAB_00192baf;
        case 6:
          uVar10 = 2;
          goto LAB_00193116;
        case 7:
          uVar10 = 2;
LAB_00192d45:
          printBranchOperand(MI,uVar10,O);
          break;
        case 8:
LAB_00192c6e:
          printAbsBranchOperand(MI,2,O);
          break;
        default:
          printOperand(MI,2,O);
LAB_001930bc:
          if ((bVar4 & 8) == 0) {
            return;
          }
          SStream_concat0(O,", ");
          switch(bVar4 >> 4 & 3) {
          case 0:
            uVar10 = 3;
LAB_00192fbf:
            printU6ImmOperand(MI,uVar10,O);
            break;
          case 1:
            printU5ImmOperand(MI,3,O);
            if ((bVar4 & 0x40) == 0) {
              return;
            }
            SStream_concat0(O,", ");
            uVar10 = 4;
            goto LAB_00192fe1;
          case 2:
            uVar10 = 3;
LAB_00192baf:
            printOperand(MI,uVar10,O);
            break;
          case 3:
            uVar10 = 3;
LAB_00193116:
            printU2ImmOperand(MI,uVar10,O);
          }
        }
        goto switchD_00192a2b_default;
      }
LAB_00192fe1:
      printU5ImmOperand(MI,uVar10,O);
      break;
    case 6:
      printU5ImmOperand(MI,2,O);
LAB_00192b3d:
      SStream_concat0(O,", ");
      uVar10 = 1;
      goto LAB_00192baf;
    case 7:
      uVar10 = 1;
      goto LAB_00192a6a;
    case 8:
      printU5ImmOperand(MI,1,O);
      SStream_concat0(O,", ");
      uVar10 = 2;
      goto LAB_00192baf;
    case 9:
      printS16ImmOperand(MI,2,O);
      SStream_concat0(O,"(");
      printOperand(MI,1,O);
      pcVar21 = ")";
      goto LAB_00192ed7;
    case 10:
      uVar10 = 2;
LAB_00192a6a:
      printMemRegImm(MI,uVar10,O);
      break;
    case 0xb:
      uVar10 = 2;
LAB_00192b23:
      printMemRegReg(MI,uVar10,O);
      break;
    case 0xc:
      uVar10 = 1;
      goto LAB_00192dbb;
    case 0xd:
      printcrbitm(MI,1,O);
      break;
    case 0xe:
      printU4ImmOperand(MI,uVar11,O_01);
      break;
    case 0xf:
      printS5ImmOperand(MI,uVar11,O_01);
    }
    goto switchD_00192a2b_default;
  }
  SStream_concat0(O,pcVar21);
  printPredicateOperand(MI,uVar11,(SStream *)0x2570cd,(char *)Modifier);
  SStream_concat0(O," ");
  printPredicateOperand(MI,uVar11,(SStream *)0x1eca86,(char *)Modifier);
switchD_00192a2b_default:
  return;
}

Assistant:

void PPC_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;

	// Check for slwi/srwi mnemonics.
	if (MCInst_getOpcode(MI) == PPC_RLWINM) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char MB = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 4));
		bool useSubstituteMnemonic = false;

		if (SH <= 31 && MB == 0 && ME == (31-SH)) {
			SStream_concat0(O, "slwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLWI);
			useSubstituteMnemonic = true;
		}

		if (SH <= 31 && MB == (32-SH) && ME == 31) {
			SStream_concat0(O, "srwi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SRWI);
			useSubstituteMnemonic = true;
			SH = 32-SH;
		}

		if (useSubstituteMnemonic) {
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			if (MI->csh->detail) {
				cs_ppc *ppc = &MI->flat_insn->detail->ppc;

				ppc->operands[ppc->op_count].type = PPC_OP_IMM;
				ppc->operands[ppc->op_count].imm = SH;
				++ppc->op_count;
			}

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_OR || MCInst_getOpcode(MI) == PPC_OR8) &&
			MCOperand_getReg(MCInst_getOperand(MI, 1)) == MCOperand_getReg(MCInst_getOperand(MI, 2))) {
		SStream_concat0(O, "mr\t");
		MCInst_setOpcodePub(MI, PPC_INS_MR);
		printOperand(MI, 0, O);
		SStream_concat0(O, ", ");
		printOperand(MI, 1, O);
		return;
	}

	if (MCInst_getOpcode(MI) == PPC_RLDICR) {
		unsigned char SH = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 2));
		unsigned char ME = (unsigned char)MCOperand_getImm(MCInst_getOperand(MI, 3));
		// rldicr RA, RS, SH, 63-SH == sldi RA, RS, SH
		if (63-SH == ME) {
			SStream_concat0(O, "sldi\t");
			MCInst_setOpcodePub(MI, PPC_INS_SLDI);
			printOperand(MI, 0, O);
			SStream_concat0(O, ", ");
			printOperand(MI, 1, O);
			if (SH > HEX_THRESHOLD)
				SStream_concat(O, ", 0x%x", (unsigned int)SH);
			else
				SStream_concat(O, ", %u", (unsigned int)SH);

			return;
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_gBC)||(MCInst_getOpcode(MI) == PPC_gBCA)||
			(MCInst_getOpcode(MI) == PPC_gBCL)||(MCInst_getOpcode(MI) == PPC_gBCLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 2));
		bd = SignExtend64(bd, 14);
		MCOperand_setImm(MCInst_getOperand(MI, 2),bd);
	}

	if (isBOCTRBranch(MCInst_getOpcode(MI))) {
		if (MCOperand_isImm(MCInst_getOperand(MI,0)))
		{
			int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
			bd = SignExtend64(bd, 14);
			MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
		}
	}

	if ((MCInst_getOpcode(MI) == PPC_B)||(MCInst_getOpcode(MI) == PPC_BA)||
			(MCInst_getOpcode(MI) == PPC_BL)||(MCInst_getOpcode(MI) == PPC_BLA)) {
		int64_t bd = MCOperand_getImm(MCInst_getOperand(MI, 0));
		bd = SignExtend64(bd, 24);
		MCOperand_setImm(MCInst_getOperand(MI, 0),bd);
	}

	// consider our own alias instructions first
	mnem = printAliasInstrEx(MI, O, Info);
	if (!mnem)
		mnem = printAliasInstr(MI, O, Info);

	if (mnem != NULL) {
		if (strlen(mnem) > 0) {
			struct ppc_alias alias;
			// check to remove the last letter of ('.', '-', '+')
			if (mnem[strlen(mnem) - 1] == '-' || mnem[strlen(mnem) - 1] == '+' || mnem[strlen(mnem) - 1] == '.')
				mnem[strlen(mnem) - 1] = '\0';

			if (PPC_alias_insn(mnem, &alias)) {
				MCInst_setOpcodePub(MI, alias.id);
				if (MI->csh->detail) {
					MI->flat_insn->detail->ppc.bc = (ppc_bc)alias.cc;
				}
			}
		}

		cs_mem_free(mnem);
	} else
		printInstruction(MI, O, NULL);
}